

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void __thiscall Am_Connection::Handle_Input(Am_Connection *this)

{
  Am_Connection_Data *pAVar1;
  Am_Unmarshall_Method AVar2;
  Am_Value in_value;
  unsigned_long net_type;
  Am_Value local_30;
  Am_Value local_20;
  undefined1 local_10 [8];
  
  pAVar1 = this->data;
  if (pAVar1 == (Am_Connection_Data *)0x0) {
    Am_Error("Invalid Connection called to handle input!");
  }
  if (pAVar1->connected != false) {
    local_30.type = 0;
    local_30.value.wrapper_value = (Am_Wrapper *)0x0;
    recv(*(int *)&(pAVar1->super_Am_Wrapper).field_0xc,local_10,8,0);
    local_20.type = (ushort)SUB41(local_10._0_4_,3) | SUB42(local_10._0_4_,1) & 0xff00;
    AVar2 = OpenAmulet::Map<unsigned_short,_Am_Unmarshall_Method,_std::less<unsigned_short>_>::GetAt
                      (&Unmarshall_Methods,&local_20.type);
    if (AVar2.from_wrapper == (Am_Method_Wrapper *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"C:hi:Unknown type received!\n",0x1c);
      std::ostream::flush();
      Am_Value::operator=(&local_30,&Am_No_Value);
      if (this->data != (Am_Connection_Data *)0x0) {
        this->data->connected = false;
      }
    }
    else {
      (*AVar2.Call)((int)&local_20,
                    (Am_Connection *)*(undefined4 *)&(this->data->super_Am_Wrapper).field_0xc);
      Am_Value::operator=(&local_30,&local_20);
      Am_Value::~Am_Value(&local_20);
      Am_Value_List::Add(&this->data->Value_Queue,&local_30,Am_TAIL,true);
      if ((this->data->my_receiver).from_wrapper != (Am_Method_Wrapper *)0x0) {
        (*(this->data->my_receiver).Call)(this);
      }
    }
    Am_Value::~Am_Value(&local_30);
    return;
  }
  Am_Error("C:HandIn:Error! Not connected!");
}

Assistant:

bool
Am_Connection::Valid(void)
{
  return (data ? true : false);
}